

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SccLiveness.cpp
# Opt level: O1

uint __thiscall SCCLiveness::CurrentOpHelperVisitedLength(SCCLiveness *this,Instr *currentInstr)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  uint uVar6;
  
  if (currentInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                       ,0x367,"(currentInstr)","currentInstr");
    if (!bVar2) goto LAB_00629998;
    *puVar5 = 0;
  }
  if (this->lastOpHelperLabel == (LabelInstr *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar3 = IR::Instr::GetNumber(currentInstr);
    uVar4 = IR::Instr::GetNumber(&this->lastOpHelperLabel->super_Instr);
    if (uVar3 < uVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                         ,0x36e,"(currentInstr->GetNumber() >= lastOpHelperLabel->GetNumber())",
                         "currentInstr->GetNumber() >= lastOpHelperLabel->GetNumber()");
      if (!bVar2) {
LAB_00629998:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    uVar3 = IR::Instr::GetNumber(currentInstr);
    uVar4 = IR::Instr::GetNumber(&this->lastOpHelperLabel->super_Instr);
    uVar6 = ((uVar3 - uVar4) + 1) - (uint)((currentInstr->m_kind - InstrKindLabel & 0xfd) == 0);
  }
  return uVar6;
}

Assistant:

uint SCCLiveness::CurrentOpHelperVisitedLength(IR::Instr *const currentInstr) const
{
    Assert(currentInstr);

    if(!lastOpHelperLabel)
    {
        return 0;
    }

    Assert(currentInstr->GetNumber() >= lastOpHelperLabel->GetNumber());
    uint visitedLength = currentInstr->GetNumber() - lastOpHelperLabel->GetNumber();
    if(!currentInstr->IsLabelInstr())
    {
        // Consider the current instruction to have been visited
        ++visitedLength;
    }
    return visitedLength;
}